

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::init
          (LayoutBindingNegativeCase *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  ostringstream *poVar2;
  ShaderType SVar3;
  ErrorType EVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  ContextType ctxType;
  int iVar8;
  undefined4 extraout_var;
  int *piVar10;
  undefined4 extraout_var_00;
  TestLog *pTVar11;
  NotSupportedError *this_00;
  uint uVar12;
  sbyte sVar13;
  iterator iVar14;
  uint uVar15;
  GLint binding;
  GLint maxTessCtrlUnits;
  GLint maxFragmentUnits;
  GLint maxVertexUnits;
  GLint maxTessEvalUnits;
  GLint maxCombinedUnits;
  GLint numBindingPoints;
  Random rnd;
  Random rnd_1;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  vector<int,_std::allocator<int>_> *local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_1c0,dVar7 ^ 0xff23a4);
  local_1d0 = 0;
  local_1dc = 0;
  local_1e0 = 0;
  local_1d4 = 0;
  local_1e4 = 0;
  local_1d8 = 0;
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_tessellation_shader")
  ;
  if (bVar5) {
    this->m_tessSupport = true;
LAB_0041e3d2:
    iVar6 = 4;
    sVar13 = 2;
  }
  else {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
    this->m_tessSupport = bVar5;
    if (bVar5) goto LAB_0041e3d2;
    if ((this->m_shaderType & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_TESS_CONTROL) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Tesselation shaders not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x309);
      goto LAB_0041eee3;
    }
    iVar6 = 2;
    sVar13 = 1;
  }
  (**(code **)(lVar9 + 0x868))(this->m_maxVertexUnitsEnum,&local_1dc);
  (**(code **)(lVar9 + 0x868))(this->m_maxFragmentUnitsEnum,&local_1e0);
  pbVar1 = &this->m_tessSupport;
  if (*pbVar1 == true) {
    (**(code **)(lVar9 + 0x868))(this->m_maxTessCtrlUnitsEnum,&local_1e4);
    (**(code **)(lVar9 + 0x868))(this->m_maxTessEvalUnitsEnum,&local_1d8);
  }
  (**(code **)(lVar9 + 0x868))(this->m_maxCombinedUnitsEnum,&local_1d4);
  (**(code **)(lVar9 + 0x868))(this->m_maxBindingPointEnum,&local_1d0);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x318);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Maximum units for uniform type in the vertex shader: ",0x35);
  std::ostream::operator<<(poVar2,local_1dc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Maximum units for uniform type in the fragment shader: ",0x37);
  std::ostream::operator<<(poVar2,local_1e0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (*pbVar1 == true) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Maximum units for uniform type in the tessellation control shader: ",0x43);
    std::ostream::operator<<(poVar2,local_1e4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Maximum units for uniform type in the tessellation evaluation shader: ",0x46);
    std::ostream::operator<<(poVar2,local_1e4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Maximum combined units for uniform type: ",0x29);
  std::ostream::operator<<(poVar2,local_1d4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Maximum binding point for uniform type: ",0x28);
  std::ostream::operator<<(poVar2,local_1d0 + -1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  uVar12 = local_1d8;
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    uVar12 = local_1dc;
    break;
  case SHADERTYPE_FRAGMENT:
    uVar12 = local_1e0;
    break;
  case SHADERTYPE_TESS_CONTROL:
    uVar12 = local_1e4;
    break;
  case SHADERTYPE_TESS_EVALUATION:
    break;
  case SHADERTYPE_ALL:
    uVar15 = local_1e0;
    if ((int)local_1dc < (int)local_1e0) {
      uVar15 = local_1dc;
    }
    if ((int)local_1e4 < (int)local_1d8) {
      uVar12 = local_1e4;
    }
    if ((int)uVar15 < (int)uVar12) {
      uVar12 = uVar15;
    }
    if (local_1d4 / iVar6 <= (int)uVar12) {
      uVar12 = local_1d4 / iVar6;
    }
    break;
  default:
    uVar12 = 0;
  }
  if (this->m_testType - TESTTYPE_BINDING_MULTIPLE < 3) {
    if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
      if ((int)uVar12 < 3) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x350);
        goto LAB_0041eee3;
      }
      uVar12 = uVar12 - 1;
    }
    else if ((int)uVar12 < 2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x356);
      goto LAB_0041eee3;
    }
    uVar15 = 7;
    if (uVar12 < 7) {
      uVar15 = uVar12;
    }
    dVar7 = deRandom_getUint32(&local_1c0);
    iVar6 = dVar7 % (uVar15 - 1) + 2;
LAB_0041e7ca:
    this->m_numBindings = iVar6;
  }
  else {
    iVar6 = 1;
    if (this->m_testType < TESTTYPE_BINDING_MULTIPLE) goto LAB_0041e7ca;
  }
  iVar6 = local_1d0;
  SVar3 = this->m_shaderType;
  if ((SVar3 == SHADERTYPE_VERTEX) || (SVar3 == SHADERTYPE_ALL)) {
    iVar8 = this->m_numBindings;
    if ((int)local_1dc < iVar8) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Vertex shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x361);
      goto LAB_0041eee3;
    }
    if ((SVar3 == SHADERTYPE_ALL) || (SVar3 == SHADERTYPE_FRAGMENT)) goto LAB_0041e806;
  }
  else if (SVar3 == SHADERTYPE_FRAGMENT) {
    iVar8 = this->m_numBindings;
LAB_0041e806:
    if ((int)local_1e0 < iVar8) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Fragment shader: not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x364);
      goto LAB_0041eee3;
    }
  }
  if (*pbVar1 == true) {
    if (((SVar3 == SHADERTYPE_ALL) || (SVar3 == SHADERTYPE_TESS_CONTROL)) &&
       ((int)local_1e4 < this->m_numBindings)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Tessellation control shader: not enough uniforms available for test",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x367);
      goto LAB_0041eee3;
    }
    if (SVar3 - SHADERTYPE_TESS_EVALUATION < 2) {
      if ((int)local_1d8 < this->m_numBindings) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Tessellation evaluation shader: not enough uniforms available for test",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x36a);
        goto LAB_0041eee3;
      }
      goto LAB_0041e848;
    }
  }
  else {
LAB_0041e848:
    if ((SVar3 == SHADERTYPE_ALL) && (local_1d4 < this->m_numBindings << sVar13)) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Not enough uniforms available for test",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                 ,0x36d);
      goto LAB_0041eee3;
    }
  }
  if (local_1d0 < this->m_numBindings) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x371);
LAB_0041eee3:
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((local_1d0 == this->m_numBindings) && (this->m_errorType == ERRORTYPE_CONTRADICTORY)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x374);
    goto LAB_0041eee3;
  }
  local_1cc = 0;
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init((deRandom *)local_1b0,dVar7 ^ 0xff23a4);
  EVar4 = this->m_errorType;
  if (EVar4 == ERRORTYPE_CONTRADICTORY) {
    iVar14._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_vertexShaderBinding,iVar14,&local_1cc);
      iVar8 = local_1cc + 1;
    }
    else {
      *iVar14._M_current = 0;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      iVar8 = 1;
    }
    local_1e8 = iVar8 % iVar6;
    iVar14._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_fragmentShaderBinding,iVar14,(int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_1e8 = (local_1cc + 2) % iVar6;
    iVar14._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessCtrlShaderBinding,iVar14,(int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_1e8 = (local_1cc + 3) % iVar6;
    iVar14._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_0041eb4c:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessEvalShaderBinding,iVar14,(int *)&local_1e8);
      goto LAB_0041eb5b;
    }
    *iVar14._M_current = local_1e8;
  }
  else if (EVar4 == ERRORTYPE_LESS_THAN_ZERO) {
    uVar12 = this->m_numBindings;
    dVar7 = deRandom_getUint32((deRandom *)local_1b0);
    local_1e8 = ~(dVar7 % uVar12);
    iVar14._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_vertexShaderBinding,iVar14,
                 (int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    iVar14._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_fragmentShaderBinding,iVar14,
                 (int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    iVar14._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_tessCtrlShaderBinding,iVar14,
                 (int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    iVar14._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_tessEvalShaderBinding,iVar14,
                 (int *)&local_1e8);
      goto LAB_0041eb5b;
    }
    *iVar14._M_current = local_1e8;
  }
  else {
    if (EVar4 != ERRORTYPE_OVER_MAX_UNITS) goto LAB_0041eb5b;
    iVar6 = iVar6 + 1;
    local_1e8 = iVar6 - this->m_numBindings;
    iVar14._M_current =
         (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_vertexShaderBinding,iVar14,(int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_1e8 = iVar6 - this->m_numBindings;
    iVar14._M_current =
         (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_fragmentShaderBinding,iVar14,(int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_1e8 = iVar6 - this->m_numBindings;
    iVar14._M_current =
         (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->m_tessCtrlShaderBinding,iVar14,(int *)&local_1e8);
    }
    else {
      *iVar14._M_current = local_1e8;
      (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_1e8 = iVar6 - this->m_numBindings;
    iVar14._M_current =
         (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0041eb4c;
    *iVar14._M_current = local_1e8;
  }
  (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((uint *)iVar14._M_current + 1);
LAB_0041eb5b:
  if (1 < this->m_numBindings) {
    local_1c8 = &this->m_vertexShaderBinding;
    iVar6 = 1;
    do {
      local_1e8 = *(this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar6;
      iVar14._M_current =
           (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_1c8,iVar14,(int *)&local_1e8);
      }
      else {
        *iVar14._M_current = local_1e8;
        (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
      local_1e8 = *(this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar6;
      iVar14._M_current =
           (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_fragmentShaderBinding,iVar14,(int *)&local_1e8);
      }
      else {
        *iVar14._M_current = local_1e8;
        (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
      piVar10 = (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1e8 = *piVar10 + iVar6;
      iVar14._M_current =
           (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_tessCtrlShaderBinding,iVar14,(int *)&local_1e8);
        piVar10 = (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *iVar14._M_current = local_1e8;
        (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
      local_1e8 = *piVar10 + iVar6;
      iVar14._M_current =
           (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->m_tessEvalShaderBinding,iVar14,(int *)&local_1e8);
      }
      else {
        *iVar14._M_current = local_1e8;
        (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar14._M_current + 1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->m_numBindings);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Creating test shaders",0x15)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar6);
  pTVar11 = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            (ShaderProgram *)CONCAT44(extraout_var_00,iVar6));
  return (int)pTVar11;
}

Assistant:

void LayoutBindingNegativeCase::init (void)
{
	// Decide appropriate binding points for the vertex and fragment shaders
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
	glw::GLint				numBindingPoints	= 0;	// Number of binding points
	glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
	glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
	glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
	glw::GLint				maxTessCtrlUnits	= 0;	// Available uniforms in tessellation control shader
	glw::GLint				maxTessEvalUnits	= 0;	// Available uniforms in tessellation evaluation shader
	glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

	m_tessSupport = m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader")
					|| contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!m_tessSupport && (m_shaderType == SHADERTYPE_TESS_EVALUATION || m_shaderType == SHADERTYPE_TESS_CONTROL))
		TCU_THROW(NotSupportedError, "Tesselation shaders not supported");

	int numShaderStages = m_tessSupport ? 4 : 2;

	gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
	gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);

	if (m_tessSupport)
	{
		gl.getIntegerv(m_maxTessCtrlUnitsEnum, &maxTessCtrlUnits);
		gl.getIntegerv(m_maxTessEvalUnitsEnum, &maxTessEvalUnits);
	}

	gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
	gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;

	if (m_tessSupport)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation control shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation evaluation shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

	// Select maximum number of uniforms used for the test
	switch (m_shaderType)
	{
		case SHADERTYPE_VERTEX:
			maxUnits = maxVertexUnits;
			break;

		case SHADERTYPE_FRAGMENT:
			maxUnits = maxFragmentUnits;
			break;

		case SHADERTYPE_ALL:
			maxUnits = de::min(de::min(de::min(maxVertexUnits, maxFragmentUnits), de::min(maxTessCtrlUnits, maxTessEvalUnits)), maxCombinedUnits/numShaderStages);
			break;

		case SHADERTYPE_TESS_CONTROL:
			maxUnits = maxTessCtrlUnits;
			break;

		case SHADERTYPE_TESS_EVALUATION:
			maxUnits = maxTessEvalUnits;
			break;

		default:
			DE_ASSERT(false);
	}

	// Select the number of uniforms (= bindings) used for this test
	switch (m_testType)
	{
		case TESTTYPE_BINDING_SINGLE:
		case TESTTYPE_BINDING_MAX:
			m_numBindings = 1;
			break;

		case TESTTYPE_BINDING_MULTIPLE:
		case TESTTYPE_BINDING_ARRAY:
		case TESTTYPE_BINDING_MAX_ARRAY:
			if (m_errorType == ERRORTYPE_CONTRADICTORY)
			{
				// leave room for contradictory case
				if (maxUnits < 3)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits-1));
			}
			else
			{
				if (maxUnits < 2)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
			}
			break;

		default:
			DE_ASSERT(false);
	}

	// Check that we have enough uniforms in different shaders to perform the tests
	if (((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Vertex shader: not enough uniforms available for test");

	if (((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Fragment shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_CONTROL) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessCtrlUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation control shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_EVALUATION) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessEvalUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation evaluation shader: not enough uniforms available for test");

	if ((m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*numShaderStages) )
		TCU_THROW(NotSupportedError, "Not enough uniforms available for test");

	// Check that we have enough binding points to perform the tests
	if (numBindingPoints < m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	if (m_errorType == ERRORTYPE_CONTRADICTORY && numBindingPoints == m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	// Initialize the binding points i.e. populate the two binding point vectors
	initBindingPoints(0, numBindingPoints);

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;
}